

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O2

void __thiscall
wasm::StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::propagate
          (TypeHierarchyPropagator<wasm::PossibleConstantValues> *this,
          StructValuesMap<wasm::PossibleConstantValues> *combinedInfos,bool toSubTypes,
          bool toSuperTypes)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer pHVar3;
  HeapType type_00;
  bool bVar4;
  StructValues<wasm::PossibleConstantValues> *this_00;
  StructValues<wasm::PossibleConstantValues> *pSVar5;
  Struct *pSVar6;
  PossibleConstantValues *pPVar7;
  PossibleConstantValues *pPVar8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar9;
  __node_base *p_Var10;
  uint uVar11;
  ulong uVar12;
  pointer pHVar13;
  optional<wasm::HeapType> oVar14;
  undefined1 local_100 [8];
  UniqueDeferredQueue<wasm::HeapType> work;
  optional<wasm::HeapType> superType;
  HeapType local_40;
  HeapType type;
  StructValuesMap<wasm::PossibleConstantValues> *__range3;
  
  UniqueDeferredQueue<wasm::HeapType>::UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::HeapType> *)local_100);
  p_Var10 = &(combinedInfos->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
             )._M_h._M_before_begin;
  type.id = (uintptr_t)combinedInfos;
  while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
    UniqueDeferredQueue<wasm::HeapType>::push
              ((UniqueDeferredQueue<wasm::HeapType> *)local_100,(HeapType)p_Var10[1]._M_nxt);
  }
  while( true ) {
    bVar4 = UniqueDeferredQueue<wasm::HeapType>::empty
                      ((UniqueDeferredQueue<wasm::HeapType> *)local_100);
    if (bVar4) break;
    local_40 = UniqueDeferredQueue<wasm::HeapType>::pop
                         ((UniqueDeferredQueue<wasm::HeapType> *)local_100);
    this_00 = StructValuesMap<wasm::PossibleConstantValues>::operator[]
                        ((StructValuesMap<wasm::PossibleConstantValues> *)type.id,local_40);
    if (toSuperTypes) {
      oVar14 = HeapType::getDeclaredSuperType(&local_40);
      work.count._M_h._M_single_bucket =
           oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      if (((undefined1  [16])
           oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        pSVar5 = StructValuesMap<wasm::PossibleConstantValues>::operator[]
                           ((StructValuesMap<wasm::PossibleConstantValues> *)type.id,
                            (HeapType)work.count._M_h._M_single_bucket);
        pSVar6 = HeapType::getStruct((HeapType *)&work.count._M_h._M_single_bucket);
        for (uVar11 = 0; uVar12 = (ulong)uVar11,
            uVar12 < (ulong)((long)(pSVar6->fields).
                                   super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar6->fields).
                                   super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4);
            uVar11 = uVar11 + 1) {
          pPVar7 = StructValues<wasm::PossibleConstantValues>::operator[](pSVar5,uVar12);
          pPVar8 = StructValues<wasm::PossibleConstantValues>::operator[](this_00,uVar12);
          bVar4 = PossibleConstantValues::combine(pPVar7,pPVar8);
          if (bVar4) {
            UniqueDeferredQueue<wasm::HeapType>::push
                      ((UniqueDeferredQueue<wasm::HeapType> *)local_100,
                       (HeapType)work.count._M_h._M_single_bucket);
          }
        }
      }
    }
    if (toSubTypes) {
      pSVar6 = HeapType::getStruct(&local_40);
      pFVar1 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pFVar2 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pvVar9 = SubTypes::getImmediateSubTypes(&this->subTypes,local_40);
      pHVar3 = (pvVar9->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (pHVar13 = (pvVar9->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_start; pHVar13 != pHVar3;
          pHVar13 = pHVar13 + 1) {
        type_00.id = pHVar13->id;
        pSVar5 = StructValuesMap<wasm::PossibleConstantValues>::operator[]
                           ((StructValuesMap<wasm::PossibleConstantValues> *)type.id,type_00);
        for (uVar11 = 0; uVar12 = (ulong)uVar11, uVar12 < (ulong)((long)pFVar1 - (long)pFVar2 >> 4);
            uVar11 = uVar11 + 1) {
          pPVar7 = StructValues<wasm::PossibleConstantValues>::operator[](pSVar5,uVar12);
          pPVar8 = StructValues<wasm::PossibleConstantValues>::operator[](this_00,uVar12);
          bVar4 = PossibleConstantValues::combine(pPVar7,pPVar8);
          if (bVar4) {
            UniqueDeferredQueue<wasm::HeapType>::push
                      ((UniqueDeferredQueue<wasm::HeapType> *)local_100,type_00);
          }
        }
      }
    }
  }
  UniqueDeferredQueue<wasm::HeapType>::~UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::HeapType> *)local_100);
  return;
}

Assistant:

void propagate(StructValuesMap<T>& combinedInfos,
                 bool toSubTypes,
                 bool toSuperTypes) {
    UniqueDeferredQueue<HeapType> work;
    for (auto& [type, _] : combinedInfos) {
      work.push(type);
    }
    while (!work.empty()) {
      auto type = work.pop();
      auto& infos = combinedInfos[type];

      if (toSuperTypes) {
        // Propagate shared fields to the supertype.
        if (auto superType = type.getDeclaredSuperType()) {
          auto& superInfos = combinedInfos[*superType];
          auto& superFields = superType->getStruct().fields;
          for (Index i = 0; i < superFields.size(); i++) {
            if (superInfos[i].combine(infos[i])) {
              work.push(*superType);
            }
          }
        }
      }

      if (toSubTypes) {
        // Propagate shared fields to the subtypes.
        auto numFields = type.getStruct().fields.size();
        for (auto subType : subTypes.getImmediateSubTypes(type)) {
          auto& subInfos = combinedInfos[subType];
          for (Index i = 0; i < numFields; i++) {
            if (subInfos[i].combine(infos[i])) {
              work.push(subType);
            }
          }
        }
      }
    }
  }